

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

void __thiscall
tinyusdz::crate::CrateReader::CrateReader
          (CrateReader *this,StreamReader *sr,CrateReaderConfig *config)

{
  int *piVar1;
  ostream *poVar2;
  int local_1e4;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss_w;
  int local_28 [2];
  CrateReaderConfig *local_20;
  CrateReaderConfig *config_local;
  StreamReader *sr_local;
  CrateReader *this_local;
  
  this->_version[0] = '\0';
  this->_version[1] = '\0';
  this->_version[2] = '\0';
  local_20 = config;
  config_local = (CrateReaderConfig *)sr;
  sr_local = (StreamReader *)this;
  TableOfContents::TableOfContents(&this->_toc);
  this->_toc_offset = 0;
  this->_tokens_index = -1;
  this->_paths_index = -1;
  this->_strings_index = -1;
  this->_fields_index = -1;
  this->_fieldsets_index = -1;
  this->_specs_index = -1;
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector(&this->_tokens);
  ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::vector
            (&this->_string_indices);
  ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::vector
            (&this->_fields);
  ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::vector
            (&this->_fieldset_indices);
  ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::vector
            (&this->_specs);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_elemPaths);
  ::std::
  vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>::
  vector(&this->_nodes);
  ::std::
  map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  ::map(&this->_live_fieldsets);
  this->_sr = (StreamReader *)config_local;
  ::std::__cxx11::string::string((string *)&this->_err);
  ::std::__cxx11::string::string((string *)&this->_warn);
  ::std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->unpackRecursionGuard);
  CrateReaderConfig::CrateReaderConfig(&this->_config);
  this->_memoryUsage = 0;
  this->_impl = (Impl *)0x0;
  memcpy(&this->_config,local_20,0x98);
  if ((this->_config).numThreads == -1) {
    local_28[1] = 1;
    local_28[0] = ::std::thread::hardware_concurrency();
    piVar1 = ::std::max<int>(local_28 + 1,local_28);
    (this->_config).numThreads = *piVar1;
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[warn]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"CrateReader");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x5c);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a0,"# of thread to use: ");
    ::std::__cxx11::to_string(&local_1c0,(this->_config).numThreads);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_1c0);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::ostringstream::str();
    PushWarn(this,&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  local_1e4 = 0x400;
  piVar1 = ::std::min<int>(&local_1e4,&(this->_config).numThreads);
  (this->_config).numThreads = *piVar1;
  return;
}

Assistant:

CrateReader::CrateReader(StreamReader *sr, const CrateReaderConfig &config) : _sr(sr), _impl(nullptr) {
  _config = config;
  if (_config.numThreads == -1) {
#if defined(__wasi__)
#else
    _config.numThreads = (std::max)(1, int(std::thread::hardware_concurrency()));
    PUSH_WARN("# of thread to use: " << std::to_string(_config.numThreads));
#endif
  }


#if defined(__wasi__)
  PUSH_WARN("Threading is disabled for WASI build.");
  _config.numThreads = 1;
#else

  // Limit to 1024 threads.
  _config.numThreads = (std::min)(1024, _config.numThreads);
#endif

  //_impl = new Impl();

}